

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Server::Impl::Impl
          (Impl *this,Inet_addr *addr,Accepted_conn_factory *cf,Executor_factory_base *ef)

{
  int iVar1;
  undefined4 extraout_var;
  Reactor_interrupter *this_00;
  element_type *r;
  Executor_factory_base *ef_local;
  Accepted_conn_factory *cf_local;
  Inet_addr *addr_local;
  Impl *this_local;
  
  this->exec_factory = ef;
  iqnet::Inet_addr::Inet_addr(&this->bind_addr,addr);
  iVar1 = (*ef->_vptr_Executor_factory_base[3])();
  std::auto_ptr<iqnet::Reactor_base>::auto_ptr
            (&this->reactor,(element_type *)CONCAT44(extraout_var,iVar1));
  this_00 = (Reactor_interrupter *)operator_new(8);
  r = std::auto_ptr<iqnet::Reactor_base>::get(&this->reactor);
  iqnet::Reactor_interrupter::Reactor_interrupter(this_00,r);
  std::auto_ptr<iqnet::Reactor_interrupter>::auto_ptr(&this->interrupter,this_00);
  std::auto_ptr<iqnet::Accepted_conn_factory>::auto_ptr(&this->conn_factory,cf);
  std::auto_ptr<iqnet::Acceptor>::auto_ptr(&this->acceptor,(element_type *)0x0);
  this->firewall = (Firewall_base *)0x0;
  this->exit_flag = false;
  this->log = (ostream *)0x0;
  this->max_req_sz = 0;
  this->ver_level = HTTP_CHECK_WEAK;
  Method_dispatcher_manager::Method_dispatcher_manager(&this->disp_manager);
  std::auto_ptr<iqxmlrpc::Interceptor>::auto_ptr(&this->interceptors,(element_type *)0x0);
  this->auth_plugin = (Auth_Plugin_base *)0x0;
  return;
}

Assistant:

Impl(
    const iqnet::Inet_addr& addr,
    iqnet::Accepted_conn_factory* cf,
    Executor_factory_base* ef):
      exec_factory(ef),
      bind_addr(addr),
      reactor(ef->create_reactor()),
      interrupter(new iqnet::Reactor_interrupter(reactor.get())),
      conn_factory(cf),
      acceptor(0),
      firewall(0),
      exit_flag(false),
      log(0),
      max_req_sz(0),
      ver_level(http::HTTP_CHECK_WEAK),
      interceptors(0),
      auth_plugin(0)
  {
  }